

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O0

void __thiscall vigra::BmpDecoderImpl::read_4bit_data(BmpDecoderImpl *this)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  value_type *pvVar5;
  long in_RDI;
  uint i;
  UInt8 *map_base;
  UInt8 index;
  int x;
  int y;
  UInt8 *mover;
  UInt8 *base;
  uint pad_size;
  int c;
  uint image_size;
  uint line_size;
  uint ncomp;
  size_type in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint local_4c;
  int local_38;
  int local_34;
  value_type *local_30;
  value_type *local_28;
  _Ios_Seekdir local_1c;
  int local_18;
  
  uVar3 = 3;
  if ((*(byte *)(in_RDI + 0x274) & 1) != 0) {
    uVar3 = 1;
  }
  uVar4 = *(int *)(in_RDI + 0x218) * uVar3;
  iVar1 = *(int *)(in_RDI + 0x21c);
  local_18 = 0;
  std::istream::seekg(in_RDI,*(_Ios_Seekdir *)(in_RDI + 0x210));
  void_vector<unsigned_char>::resize
            ((void_vector<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98
            );
  uVar2 = (long)(*(int *)(in_RDI + 0x218) + 1) / 2;
  local_1c = (_Ios_Seekdir)
             ((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) % 4);
  if (local_1c != _S_beg) {
    local_1c = 4 - local_1c;
  }
  local_28 = void_vector<unsigned_char>::data((void_vector<unsigned_char> *)0x14f6e0);
  local_28 = local_28 + iVar1 * uVar4;
  local_34 = *(int *)(in_RDI + 0x21c);
  while (local_34 = local_34 + -1, -1 < local_34) {
    local_28 = local_28 + -(ulong)uVar4;
    local_30 = local_28;
    for (local_38 = 0; local_38 < *(int *)(in_RDI + 0x218); local_38 = local_38 + 1) {
      if (local_38 % 2 == 0) {
        local_18 = std::istream::get();
      }
      pvVar5 = void_vector<unsigned_char>::data((void_vector<unsigned_char> *)0x14f7af);
      for (local_4c = 0; local_4c < uVar3; local_4c = local_4c + 1) {
        local_30[local_4c] =
             pvVar5[(ulong)local_4c +
                    (long)(int)((uint)((byte)(local_18 >> (1U - (char)(local_38 % 2) & 0x1f)) & 0xf)
                               * 3)];
      }
      local_30 = local_30 + uVar3;
    }
    std::istream::seekg(in_RDI,local_1c);
  }
  return;
}

Assistant:

void BmpDecoderImpl::read_4bit_data ()
{
    // these are sizes for the final image
    const unsigned int ncomp = grayscale ? 1 : 3;
    const unsigned int line_size = info_header.width * ncomp;
    const unsigned int image_size = info_header.height * line_size;
    int c = 0;

    // seek to the data
    stream.seekg( file_header.offset, std::ios::beg );

    // make room for the pixels
    pixels.resize(image_size);

    // padding after each line (must end on a 32-bit boundary)
    unsigned int pad_size = ( ( info_header.width + 1 ) / 2 ) % 4;
    if ( pad_size > 0 )
        pad_size = 4 - pad_size;

    // setup the base pointer at one line after the end
    UInt8 * base = pixels.data() + image_size;
    UInt8 * mover = base;

    // read scanlines from bottom to top
    for ( int y = info_header.height - 1; y >= 0; --y ) {

        // set the base pointer to the beginning of the line to be read
        base -= line_size;
        mover = base;

        // read the line from left to right
        for ( int x = 0; x < info_header.width; ++x ) {

            // eventually get a new byte from the stream
            if ( x % 2 == 0 )
                c = stream.get();

            // get the color index
            const UInt8 index = ( c >> ( 1 - ( x % 2 ) ) ) & 0x0f;

            // map and assign the pixel
            const UInt8 * map_base = map.data() + 3 * index;
            for ( unsigned int i = 0; i < ncomp; ++i )
                mover[i] = map_base[i];
            mover += ncomp;
        }

        // advance to the next 32 bit boundary
        stream.seekg( pad_size, std::ios::cur );
    }
}